

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

Am_Wrapper * long_range_ship_fill_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Object bitmap;
  Am_Object item;
  Am_Object local_18;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  local_18.data = (Am_Object_Data *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0xa3);
  Am_Object::operator=(&local_10,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_10,(ulong)SHIP_BITMAP);
  Am_Object::operator=(&local_18,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x6b);
  pAVar2 = Am_Value::operator_cast_to_Am_Wrapper_(pAVar1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  return pAVar2;
}

Assistant:

Am_Define_Style_Formula(long_range_ship_fill)
{
  Am_Object item, bitmap;
  item = self.Get(Am_ITEM);
  bitmap = item.Get(SHIP_BITMAP);
  return (bitmap.Get(Am_LINE_STYLE));
}